

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

void __thiscall PlayerStrategy::PlayerStrategy(PlayerStrategy *this,PlayerStrategy *toCopy)

{
  Country *pCVar1;
  int *piVar2;
  string *__return_storage_ptr__;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_0013d8d0;
  piVar2 = (int *)operator_new(4);
  *piVar2 = -1;
  this->numWeakest = piVar2;
  piVar2 = toCopy->exchangingCardType;
  this->armiesToPlace = toCopy->armiesToPlace;
  this->exchangingCardType = piVar2;
  pCVar1 = toCopy->from;
  this->player = toCopy->player;
  this->from = pCVar1;
  this->to = toCopy->to;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  getStrategyName_abi_cxx11_(__return_storage_ptr__,toCopy);
  this->strategyName = __return_storage_ptr__;
  return;
}

Assistant:

PlayerStrategy::PlayerStrategy(const PlayerStrategy& toCopy) {
    this->exchangingCardType = toCopy.exchangingCardType;
    this->armiesToPlace = toCopy.armiesToPlace;
    this->player = toCopy.player;
    this->from = toCopy.from;
    this->to = toCopy.to;
    this->strategyName = new std::string(toCopy.getStrategyName());
}